

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::HDivPermutation
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,int side,
          TPZVec<int> *permutegather)

{
  int iVar1;
  MElementType MVar2;
  ostream *this_00;
  TPZGeoNode *pTVar3;
  TPZManVector<long,_4> id;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&id);
  this_00 = std::operator<<((ostream *)&id.super_TPZVec<long>.fNElements,
                            "HDivPermutation called with wrong side parameter ");
  std::ostream::operator<<(this_00,side);
  std::__cxx11::stringstream::~stringstream((stringstream *)&id);
  TPZManVector<long,_4>::TPZManVector(&id,1);
  iVar1 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x2d0))(this,side,0);
  pTVar3 = TPZGeoEl::NodePtr(&this->super_TPZGeoEl,iVar1);
  *id.super_TPZVec<long>.fStore = (long)pTVar3->fId;
  MVar2 = pztopology::TPZPoint::Type(side);
  switch(MVar2) {
  case EPoint:
    *permutegather->fStore = 0;
    break;
  case EOned:
    iVar1 = pztopology::TPZLine::GetTransformId(&id.super_TPZVec<long>);
    pztopology::TPZLine::GetSideHDivPermutation(iVar1,permutegather);
    break;
  case ETriangle:
    iVar1 = pztopology::TPZTriangle::GetTransformId(&id.super_TPZVec<long>);
    pztopology::TPZTriangle::GetSideHDivPermutation(iVar1,permutegather);
    break;
  case EQuadrilateral:
    iVar1 = pztopology::TPZQuadrilateral::GetTransformId(&id.super_TPZVec<long>);
    pztopology::TPZQuadrilateral::GetSideHDivPermutation(iVar1,permutegather);
    break;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
               ,0x364);
  }
  TPZManVector<long,_4>::~TPZManVector(&id);
  return;
}

Assistant:

inline void TPZGeoElRefLess<TGeo>::HDivPermutation(int side, TPZVec<int> &permutegather)
{
	int dimension = TGeo::Dimension;
	int sidedimension = TGeo::SideDimension(side);

	if(dimension != sidedimension+1)
	{
		std::stringstream sout;
		sout << "HDivPermutation called with wrong side parameter " << side;
#ifdef PZ_LOG
        TPZLogger loggerrefless ("pz.mesh.tpzgeoelrefless");
		LOGPZ_ERROR(loggerrefless,sout.str())
#endif
	}
    
    // Douglas -- teste em 2014 09 04
    // conta o numero de lados da face
    const int64_t nsidenodes = TGeo::NSideNodes(side);
    TPZManVector<int64_t,4> id(nsidenodes);  // 
    
	for(int inode=0; inode<nsidenodes; inode++)
    {
        // esta parte pega os indices locais dos nos apenas da face em questao
        int64_t nodeindex = SideNodeLocId(side, inode);
        // com base nestes indices locais, pegamos os indices globais para determinar a permutacao
        id[inode] = NodePtr(nodeindex)->Id();
    }
    
    // Esse bloco parece pegar todos os vertices do cubo para fazer a permutacao, deveria ser da face
//    TPZManVector<int64_t,TGeo::NCornerNodes> id(TGeo::NCornerNodes);
//	for(int i=0; i<TGeo::NCornerNodes; i++)
//    {
//        int64_t nodeindex = fGeo.fNodeIndexes[i];
//        id[i] = Mesh()->NodeVec()[nodeindex].Id();
//    }
    
    MElementType sidetype = TGeo::Type(side);
    int transformid;
    switch (sidetype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(id);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(id);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(id);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EPoint:
            transformid = 0;
            permutegather[0] = 0;
            break;
        default:
            DebugStop();
            break;
    }
#ifdef PZ_LOG
    TPZLogger loggerrefless ("pz.mesh.tpzgeoelrefless");
    if (loggerrefless.isDebugEnabled()) {
        std::stringstream sout;
        sout << "side = " << side << " transform id " << transformid << " permutegather " << permutegather;
        LOGPZ_DEBUG(loggerrefless, sout.str())
    }
#endif
}